

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_BasicCommands.c
# Opt level: O3

void test_CmdGetDaqResolutionInfo(void)

{
  XcpLight_self.session_status = XcpLight_self.session_status | 2;
  XcpLight_self.protection_status = '\0';
  cmdMsg.length = 1;
  cmdMsg.payload[0] = 0xd9;
  XcpLight_processCommand(&cmdMsg);
  UnityAssertEqualNumber(8,(ulong)(byte)reply_msg.length,(char *)0x0,0x94,UNITY_DISPLAY_STYLE_UINT8)
  ;
  UnityAssertEqualNumber
            (0xff,(ulong)reply_msg.payload[0],(char *)0x0,0x95,UNITY_DISPLAY_STYLE_UINT8);
  return;
}

Assistant:

void test_CmdGetDaqResolutionInfo(void)
{
  SET_SESSION_CONNECTED();
  SET_UNLOCK_ALL_RESOURCES();
  cmdMsg.length = 1u;
  cmdMsg.payload[0] = XCP_CMD_GET_DAQ_RESOLUTION_INFO;

  XcpLight_processCommand(&cmdMsg);

  TEST_ASSERT_EQUAL_UINT8(  8u, reply_msg.length);
  TEST_ASSERT_EQUAL_UINT8(0xFF, reply_msg.payload[0]); // Ok:GET_DAQ_DAQ_RESOLUTION_INFO
}